

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O1

void __thiscall cp::PlanFootprints::calcNextWaistPose(PlanFootprints *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Packet2d b_zw;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar2 = *(double *)(this + 0x300);
  dVar1 = cos(dVar2 * 0.5);
  dVar2 = sin(dVar2 * 0.5);
  dVar8 = dVar2 * 0.0;
  dVar13 = dVar2 * 0.0;
  dVar14 = dVar1 * 0.0;
  dVar9 = dVar8 * 0.0;
  auVar6._8_4_ = SUB84(dVar9 - dVar13,0);
  auVar6._0_8_ = dVar9 - dVar14;
  auVar6._12_4_ = (int)((ulong)(dVar9 - dVar13) >> 0x20);
  auVar6 = auVar6 ^ ZEXT816(0x8000000000000000);
  dVar5 = auVar6._0_8_ + dVar8 + dVar13;
  dVar7 = auVar6._8_8_ + dVar8 + dVar14;
  auVar11._8_4_ = SUB84(dVar9 + dVar13,0);
  auVar11._0_8_ = dVar9 + dVar14;
  auVar11._12_4_ = (int)((ulong)(dVar9 + dVar13) >> 0x20);
  dVar10 = SUB168(auVar11 ^ _DAT_0010a060,0) + (dVar2 - dVar9);
  dVar12 = SUB168(auVar11 ^ _DAT_0010a060,8) + (dVar1 - dVar9);
  dVar2 = *(double *)(this + 0x1f0);
  dVar1 = *(double *)(this + 0x1f8);
  dVar8 = *(double *)(this + 0x200);
  dVar9 = *(double *)(this + 0x208);
  dVar13 = dVar8 * dVar5 - dVar2 * dVar10;
  auVar3._8_4_ = SUB84(dVar13,0);
  auVar3._0_8_ = dVar8 * dVar7 - dVar2 * dVar12;
  auVar3._12_4_ = (int)((ulong)dVar13 >> 0x20);
  auVar3 = auVar3 ^ ZEXT816(0x8000000000000000);
  dVar14 = auVar3._0_8_ + dVar1 * dVar10 + dVar9 * dVar5;
  dVar4 = auVar3._8_8_ + dVar1 * dVar12 + dVar9 * dVar7;
  dVar13 = -(dVar2 * dVar5 + dVar8 * dVar10) + (dVar9 * dVar12 - dVar1 * dVar7);
  dVar2 = dVar2 * dVar7 + dVar8 * dVar12 + (dVar9 * dVar10 - dVar1 * dVar5);
  dVar1 = dVar4 * *(double *)(this + 0x2f8) - *(double *)(this + 0x2f0) * dVar2;
  dVar8 = dVar2 * *(double *)(this + 0x2e8) - *(double *)(this + 0x2f8) * dVar14;
  dVar9 = *(double *)(this + 0x2f0) * dVar14 - *(double *)(this + 0x2e8) * dVar4;
  dVar1 = dVar1 + dVar1;
  dVar8 = dVar8 + dVar8;
  dVar9 = dVar9 + dVar9;
  *(double *)(this + 0x1d0) =
       dVar13 * dVar1 + *(double *)(this + 0x2e8) + (dVar4 * dVar9 - dVar8 * dVar2) +
       *(double *)(this + 0x1d0);
  *(double *)(this + 0x1d8) =
       dVar13 * dVar8 + *(double *)(this + 0x2f0) + (dVar2 * dVar1 - dVar9 * dVar14) +
       *(double *)(this + 0x1d8);
  *(undefined8 *)(this + 0x1e0) = 0;
  *(double *)(this + 0x1f0) = dVar14;
  *(double *)(this + 0x1f8) = dVar4;
  *(double *)(this + 0x200) = dVar2;
  *(double *)(this + 0x208) = dVar13;
  return;
}

Assistant:

void PlanFootprints::calcNextWaistPose() {
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);
}